

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall string::unicode_too_big::test_method(unicode_too_big *this)

{
  JSONType local_180 [2];
  undefined8 local_178;
  shared_count sStack_170;
  undefined4 local_164;
  undefined **local_160;
  undefined1 local_158;
  undefined8 *local_150;
  char *local_148;
  JSONParser parser;
  char *local_120;
  char *local_118;
  string json;
  char *local_a0;
  char *local_98;
  string local_90;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  std::__cxx11::string::string((string *)&json,"\"This is \\u12345 unicode\"",(allocator *)&parser);
  parser.p = json._M_dataplus._M_p;
  parser.pe = json._M_dataplus._M_p + json._M_string_length;
  parser.skipOverErrors = false;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  parser.eof = parser.pe;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x83);
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_001169d8;
  local_150 = &boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
  ;
  local_118 = "";
  local_180[0] = yajp::JSONParser::getNextType(&parser,false);
  local_164 = 0x22;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,yajp::JSONParser::JSONType,yajp::JSONParser::JSONType>
            (&local_160,&local_120,0x83,1,2,local_180,"parser.getNextType()",&local_164,
             "yajp::JSONParser::string");
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x84);
  yajp::JSONParser::readString_abi_cxx11_(&local_90,&parser);
  std::__cxx11::string::~string((string *)&local_90);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_string.cpp"
  ;
  local_98 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x84);
  local_180[0] = local_180[0] & 0xffffff00;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_00116ce8;
  local_150 = &boost::unit_test::lazy_ostream::inst;
  local_148 = "exception std::logic_error expected but not raised";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_170);
  std::__cxx11::string::~string((string *)&json);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( unicode_too_big ) {
    std::string json("\"This is \\u12345 unicode\"");

    yajp::JSONParser parser(json);
    BOOST_CHECK_EQUAL(parser.getNextType(), yajp::JSONParser::string);
    BOOST_REQUIRE_THROW(parser.readString(), std::logic_error);
}